

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

void Str_MuxStructDump_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Str_t *vStr)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  undefined8 uStack_40;
  undefined1 local_38 [24];
  
  if ((pObj->field_0x3 & 0x40) != 0) {
    uStack_40 = 0x6478d3;
    Vec_StrPush(vStr,'[');
    uStack_40 = 0x6478de;
    Vec_StrPush(vStr,'(');
    uStack_40 = 0x6478e9;
    uVar1 = Gia_ObjFaninId2p(p,pObj);
    if (uVar1 == 0) {
      uStack_40 = 0x64793b;
      Vec_StrPush(vStr,'0');
    }
    else {
      if ((int)uVar1 < 0) {
        uStack_40 = 0x6478fa;
        Vec_StrPush(vStr,'-');
        uVar1 = 1;
      }
      lVar4 = 0;
      for (; uVar1 != 0; uVar1 = uVar1 / 10) {
        local_38[lVar4] = (char)(uVar1 % 10);
        lVar4 = lVar4 + 1;
      }
      for (; 0 < lVar4; lVar4 = lVar4 + -1) {
        uStack_40 = 0x647929;
        Vec_StrPush(vStr,local_38[lVar4 + -1] + '0');
      }
    }
    uStack_40 = 0x647946;
    Vec_StrPush(vStr,')');
    uStack_40 = 0x647951;
    iVar2 = Gia_ObjFaninC2(p,pObj);
    uVar3 = *(ulong *)pObj >> 0x20;
    if (iVar2 != 0) {
      uVar3 = *(ulong *)pObj;
    }
    uStack_40 = 0x64797f;
    Str_MuxStructDump_rec(p,pObj + -(uVar3 & 0x1fffffff),vStr);
    uStack_40 = 0x64798a;
    Vec_StrPush(vStr,'|');
    uStack_40 = 0x647995;
    iVar2 = Gia_ObjFaninC2(p,pObj);
    uVar3 = *(ulong *)pObj >> 0x20;
    if (iVar2 == 0) {
      uVar3 = *(ulong *)pObj;
    }
    uStack_40 = 0x6479bd;
    Str_MuxStructDump_rec(p,pObj + -(uVar3 & 0x1fffffff),vStr);
    uStack_40 = 0x5d;
    Vec_StrPush(vStr,']');
    return;
  }
  return;
}

Assistant:

void Str_MuxStructDump_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Str_t * vStr )
{
    if ( !pObj->fMark0 )
        return;
    Vec_StrPush( vStr, '[' );
    Vec_StrPush( vStr, '(' );
    Vec_StrPrintNum( vStr, Gia_ObjFaninId2p(p, pObj) );
    Vec_StrPush( vStr, ')' );
    Str_MuxStructDump_rec( p, Gia_ObjFaninC2(p, pObj) ? Gia_ObjFanin0(pObj) : Gia_ObjFanin1(pObj), vStr );
    Vec_StrPush( vStr, '|' );
    Str_MuxStructDump_rec( p, Gia_ObjFaninC2(p, pObj) ? Gia_ObjFanin1(pObj) : Gia_ObjFanin0(pObj), vStr );
    Vec_StrPush( vStr, ']' );
}